

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_to_bytes(uchar *buf,secp256k1_ge *a)

{
  int iVar1;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_58;
  
  iVar1 = secp256k1_ge_is_infinity(a);
  if (iVar1 == 0) {
    secp256k1_ge_to_storage(&local_58,a);
    *(uint64_t *)(buf + 0x30) = local_58.y.n[2];
    *(uint64_t *)(buf + 0x38) = local_58.y.n[3];
    *(uint64_t *)(buf + 0x20) = local_58.y.n[0];
    *(uint64_t *)(buf + 0x28) = local_58.y.n[1];
    *(uint64_t *)(buf + 0x10) = local_58.x.n[2];
    *(uint64_t *)(buf + 0x18) = local_58.x.n[3];
    *(uint64_t *)buf = local_58.x.n[0];
    *(uint64_t *)(buf + 8) = local_58.x.n[1];
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/group_impl.h"
          ,0x3d6,"test condition failed: !secp256k1_ge_is_infinity(a)");
  abort();
}

Assistant:

static void secp256k1_ge_to_bytes(unsigned char *buf, const secp256k1_ge *a) {
    secp256k1_ge_storage s;

    /* We require that the secp256k1_ge_storage type is exactly 64 bytes.
     * This is formally not guaranteed by the C standard, but should hold on any
     * sane compiler in the real world. */
    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(a));
    secp256k1_ge_to_storage(&s, a);
    memcpy(buf, &s, 64);
}